

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_log.c
# Opt level: O0

int metacall_log(metacall_log_id log_id,void *ctx)

{
  log_policy plVar1;
  log_policy plVar2;
  log_policy plVar3;
  log_policy plVar4;
  undefined4 in_EDI;
  metacall_log_custom custom_ctx;
  metacall_log_nginx nginx_ctx;
  metacall_log_syslog syslog_ctx;
  metacall_log_socket socket_ctx;
  metacall_log_file file_ctx;
  metacall_log_stdio stdio_ctx;
  FILE *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  uint16_t port;
  _func_int_void_ptr *in_stack_ffffffffffffff40;
  log_policy_format_custom_deserialize_ptr in_stack_ffffffffffffff48;
  log_policy_format_custom_serialize_ptr in_stack_ffffffffffffff50;
  log_policy_format_custom_size_ptr in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  int local_4;
  
  switch(in_EDI) {
  case 0:
    plVar1 = log_policy_format_text_flags(0);
    plVar2 = log_policy_schedule_sync();
    plVar3 = log_policy_storage_sequential();
    plVar4 = log_policy_stream_stdio(in_stack_ffffffffffffff30);
    local_4 = log_configure_impl("metacall",4,plVar1,plVar2,plVar3,plVar4);
    break;
  case 1:
    plVar1 = log_policy_format_text_flags(0);
    plVar2 = log_policy_schedule_sync();
    plVar3 = log_policy_storage_sequential();
    plVar4 = log_policy_stream_file((char *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    local_4 = log_configure_impl("metacall",4,plVar1,plVar2,plVar3,plVar4);
    break;
  case 2:
    plVar1 = log_policy_format_text_flags(0);
    port = (uint16_t)((ulong)in_stack_ffffffffffffff38 >> 0x30);
    plVar2 = log_policy_schedule_sync();
    plVar3 = log_policy_storage_sequential();
    plVar4 = log_policy_stream_socket((char *)in_stack_ffffffffffffff40,port);
    local_4 = log_configure_impl("metacall",4,plVar1,plVar2,plVar3,plVar4);
    break;
  case 3:
    plVar1 = log_policy_format_text_flags(0);
    plVar2 = log_policy_schedule_sync();
    plVar3 = log_policy_storage_sequential();
    plVar4 = log_policy_stream_syslog((char *)in_stack_ffffffffffffff30);
    local_4 = log_configure_impl("metacall",4,plVar1,plVar2,plVar3,plVar4);
    break;
  case 4:
    plVar1 = log_policy_format_text_flags(0);
    plVar2 = log_policy_schedule_sync();
    plVar3 = log_policy_storage_sequential();
    plVar4 = log_policy_stream_nginx
                       ((ngx_log_t *)plVar3,(_func_void *)plVar2,(uint16_t)((ulong)plVar1 >> 0x30));
    local_4 = log_configure_impl("metacall",4,plVar1,plVar2,plVar3,plVar4);
    break;
  case 5:
    plVar1 = log_policy_format_custom
                       (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                        in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    plVar2 = log_policy_schedule_sync();
    plVar3 = log_policy_storage_sequential();
    plVar4 = log_policy_stream_custom
                       (in_stack_ffffffffffffff50,
                        (_func_int_void_ptr_char_ptr_size_t *)in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    local_4 = log_configure_impl("metacall",4,plVar1,plVar2,plVar3,plVar4);
    break;
  default:
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int metacall_log(enum metacall_log_id log_id, void *ctx)
{
	switch (log_id)
	{
		case METACALL_LOG_STDIO: {
			metacall_log_stdio stdio_ctx = (metacall_log_stdio)ctx;

			return log_configure("metacall",
				log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_NEWLINE),
				log_policy_schedule_sync(),
				log_policy_storage_sequential(),
				log_policy_stream_stdio(stdio_ctx->stream));
		}

		case METACALL_LOG_FILE: {
			metacall_log_file file_ctx = (metacall_log_file)ctx;

			return log_configure("metacall",
				log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_NEWLINE),
				log_policy_schedule_sync(),
				log_policy_storage_sequential(),
				log_policy_stream_file(file_ctx->file_name, file_ctx->mode));
		}

		case METACALL_LOG_SOCKET: {
			metacall_log_socket socket_ctx = (metacall_log_socket)ctx;

			return log_configure("metacall",
				log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_EMPTY),
				log_policy_schedule_sync(),
				log_policy_storage_sequential(),
				log_policy_stream_socket(socket_ctx->ip, socket_ctx->port));
		}

		case METACALL_LOG_SYSLOG: {
			metacall_log_syslog syslog_ctx = (metacall_log_syslog)ctx;

			return log_configure("metacall",
				log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_NEWLINE),
				log_policy_schedule_sync(),
				log_policy_storage_sequential(),
				log_policy_stream_syslog(syslog_ctx->name));
		}

		case METACALL_LOG_NGINX: {
			metacall_log_nginx nginx_ctx = (metacall_log_nginx)ctx;

			return log_configure("metacall",
				log_policy_format_text_flags(LOG_POLICY_FORMAT_TEXT_EMPTY),
				log_policy_schedule_sync(),
				log_policy_storage_sequential(),
				log_policy_stream_nginx(nginx_ctx->log, nginx_ctx->log_error, nginx_ctx->log_level));
		}

		case METACALL_LOG_CUSTOM: {
			metacall_log_custom custom_ctx = (metacall_log_custom)ctx;

			return log_configure("metacall",
				log_policy_format_custom(custom_ctx->context, (log_policy_format_custom_size_ptr)custom_ctx->format_size, (log_policy_format_custom_serialize_ptr)custom_ctx->format_serialize, (log_policy_format_custom_deserialize_ptr)custom_ctx->format_deserialize),
				log_policy_schedule_sync(),
				log_policy_storage_sequential(),
				log_policy_stream_custom(custom_ctx->context, custom_ctx->stream_write, custom_ctx->stream_flush));
		}
	}

	return 1;
}